

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::basisu_transcoder::transcode_slice
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t slice_index,
          void *pOutput_blocks,uint32_t output_blocks_buf_size_in_blocks_or_pixels,block_format fmt,
          uint32_t output_block_or_pixel_stride_in_bytes,uint32_t decode_flags,
          uint32_t output_row_pitch_in_blocks_or_pixels,basisu_transcoder_state *pState,
          void *pAlpha_blocks,uint32_t output_rows_in_pixels,int channel0,int channel1)

{
  bool bVar1;
  block_format bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint image_data_size;
  block_format in_ECX;
  uint in_EDX;
  basis_slice_desc *unaff_RBX;
  uint32_t unaff_EBP;
  basis_file_header *in_RSI;
  void *in_RDI;
  undefined8 in_R8;
  uint in_R9D;
  uint32_t unaff_R12D;
  basisu_transcoder_state *unaff_R13;
  void *unaff_R15;
  block_format in_stack_00000008;
  uint in_stack_00000018;
  uint32_t in_stack_00000020;
  uint32_t in_stack_00000038;
  undefined4 in_stack_00000048;
  uint32_t data_size_left;
  uint32_t total_blocks_fxt1;
  uint32_t num_blocks_fxt1_y;
  uint32_t num_blocks_fxt1_x;
  uint32_t total_4x4_blocks;
  basis_slice_desc *slice_desc;
  uint8_t *pDataU8;
  basis_file_header *pHeader;
  undefined1 local_178 [16];
  uint local_168;
  packed_uint<4U> *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  basisu_transcoder *in_stack_fffffffffffffeb8;
  undefined4 in_stack_ffffffffffffff28;
  uint8_t *puVar6;
  undefined4 in_stack_ffffffffffffff40;
  undefined2 uVar7;
  basis_file_header *pbVar8;
  undefined4 in_stack_ffffffffffffff70;
  block_format in_stack_ffffffffffffff80;
  uint32_t output_block_or_pixel_stride_in_bytes_00;
  basis_file_header *header;
  undefined4 in_stack_ffffffffffffffa0;
  uint32_t output_row_pitch_in_blocks_or_pixels_00;
  undefined8 uVar9;
  block_format fmt_00;
  uint uVar10;
  uint32_t output_block_or_pixel_stride_in_bytes_01;
  int channel0_00;
  void *pvVar11;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint32_t decode_flags_00;
  
  if ((*(byte *)((long)in_RDI + 0x311) & 1) == 0) {
    return false;
  }
  if ((in_stack_00000018 & 2) != 0) {
    return false;
  }
  pvVar11 = in_RDI;
  bVar1 = validate_header_quick
                    (in_stack_fffffffffffffeb8,
                     (void *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (uint32_t)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  channel0_00 = (int)pvVar11;
  if (!bVar1) {
    return false;
  }
  header = in_RSI;
  fmt_00 = in_ECX;
  pbVar8 = in_RSI;
  bVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)&in_RSI->m_total_slices)
  ;
  output_block_or_pixel_stride_in_bytes_01 = (uint32_t)pbVar8;
  if (bVar2 <= in_ECX) {
    return false;
  }
  pbVar8 = in_RSI;
  uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_fffffffffffffea0);
  puVar6 = (uint8_t *)((long)&pbVar8->m_sig + (ulong)fmt_00 * 0x17 + (ulong)uVar3);
  uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 9));
  uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 0xb));
  uVar5 = uVar3 * uVar4;
  bVar1 = basis_block_format_is_uncompressed(in_stack_00000008);
  if (bVar1) {
    if (in_stack_00000020 == 0) {
      in_stack_00000020 =
           basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 5));
    }
    if (in_stack_00000038 == 0) {
      in_stack_00000038 =
           basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 7));
    }
    if (in_R9D < in_stack_00000038 * in_stack_00000020) {
      return false;
    }
  }
  else if (in_stack_00000008 == cFXT1_RGB) {
    uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 5));
    in_stack_ffffffffffffff80 = uVar4 + 7 >> 3;
    uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 7));
    if (in_R9D < in_stack_ffffffffffffff80 * (uVar4 + 3 >> 2)) {
      return false;
    }
  }
  else if (in_R9D < uVar5) {
    return false;
  }
  if ((in_stack_00000008 == cETC1) ||
     ((in_stack_00000008 != cPVRTC1_4_RGB && (in_stack_00000008 != cPVRTC1_4_RGBA)))) {
LAB_001b3887:
    uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_fffffffffffffea0);
    if (in_EDX < uVar4) {
      bVar1 = false;
    }
    else {
      uVar10 = in_EDX;
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_fffffffffffffea0);
      image_data_size = in_EDX - uVar4;
      uVar5 = image_data_size;
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_fffffffffffffea0);
      uVar7 = (undefined2)(in_EDX >> 0x10);
      if (image_data_size < uVar4) {
        bVar1 = false;
      }
      else {
        uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint *)&header->m_tex_format);
        if (uVar4 == 1) {
          uVar9 = in_R8;
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 9));
          decode_flags_00 = (uint32_t)unaff_RBX;
          output_row_pitch_in_blocks_or_pixels_00 = (uint32_t)uVar9;
          basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 0xb));
          output_block_or_pixel_stride_in_bytes_00 = (uint32_t)puVar6;
          uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_fffffffffffffea0);
          puVar6 = (in_RSI->m_sig).m_bytes + uVar4;
          basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_fffffffffffffea0);
          local_168 = (uint)((in_stack_00000018 & 8) == 0);
          bVar1 = basisu_lowlevel_uastc_transcoder::transcode_slice
                            ((basisu_lowlevel_uastc_transcoder *)
                             CONCAT44(in_stack_00000048,in_stack_ffffffffffffff40),local_178,
                             (uint32_t)((ulong)puVar6 >> 0x20),(uint32_t)puVar6,
                             (uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffff28),
                             (uint32_t)((ulong)in_R8 >> 0x20),in_stack_ffffffffffffff80,
                             output_block_or_pixel_stride_in_bytes_00,SUB81((ulong)in_R8 >> 0x18,0),
                             header,(basis_slice_desc *)CONCAT44(in_R9D,in_stack_ffffffffffffffa0),
                             output_row_pitch_in_blocks_or_pixels_00,
                             (basisu_transcoder_state *)CONCAT44(uVar10,fmt_00),
                             output_block_or_pixel_stride_in_bytes_01,channel0_00,
                             in_stack_ffffffffffffffc8,decode_flags_00);
        }
        else {
          basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 9));
          basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 0xb));
          basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_fffffffffffffea0);
          basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_fffffffffffffea0);
          local_168 = (uint)((in_stack_00000018 & 8) == 0);
          bVar1 = basisu_lowlevel_etc1s_transcoder::transcode_slice
                            ((basisu_lowlevel_etc1s_transcoder *)
                             CONCAT44(uVar5,in_stack_ffffffffffffff70),in_RDI,in_ECX,uVar3,
                             (uint8_t *)pbVar8,image_data_size,fmt_00,
                             output_block_or_pixel_stride_in_bytes_01,SUB21((ushort)uVar7 >> 8,0),
                             (basis_file_header *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_RBX
                             ,unaff_R12D,unaff_R13,SUB21(uVar7,0),unaff_R15,unaff_EBP);
        }
      }
    }
  }
  else {
    uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 9));
    bVar1 = basisu::is_pow2(uVar4 << 2);
    if (bVar1) {
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(puVar6 + 0xb));
      bVar1 = basisu::is_pow2(uVar4 << 2);
      if (bVar1) goto LAB_001b3887;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool basisu_transcoder::transcode_slice(const void* pData, uint32_t data_size, uint32_t slice_index, void* pOutput_blocks, uint32_t output_blocks_buf_size_in_blocks_or_pixels, block_format fmt,
		uint32_t output_block_or_pixel_stride_in_bytes, uint32_t decode_flags, uint32_t output_row_pitch_in_blocks_or_pixels, basisu_transcoder_state* pState, void *pAlpha_blocks, uint32_t output_rows_in_pixels, int channel0, int channel1) const
	{
		if (!m_ready_to_transcode)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: must call start_transcoding first\n");
			return false;
		}

		if (decode_flags & cDecodeFlagsPVRTCDecodeToNextPow2)
		{
			// TODO: Not yet supported
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: cDecodeFlagsPVRTCDecodeToNextPow2 currently unsupported\n");
			return false;
		}

		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: header validation failed\n");
			return false;
		}

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);

		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);

		if (slice_index >= pHeader->m_total_slices)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: slice_index >= pHeader->m_total_slices\n");
			return false;
		}

		const basis_slice_desc& slice_desc = reinterpret_cast<const basis_slice_desc*>(pDataU8 + pHeader->m_slice_desc_file_ofs)[slice_index];

		uint32_t total_4x4_blocks = slice_desc.m_num_blocks_x * slice_desc.m_num_blocks_y;
		
		if (basis_block_format_is_uncompressed(fmt))
		{
			// Assume the output buffer is orig_width by orig_height
			if (!output_row_pitch_in_blocks_or_pixels)
				output_row_pitch_in_blocks_or_pixels = slice_desc.m_orig_width;

			if (!output_rows_in_pixels)
				output_rows_in_pixels = slice_desc.m_orig_height;

			// Now make sure the output buffer is large enough, or we'll overwrite memory.
			if (output_blocks_buf_size_in_blocks_or_pixels < (output_rows_in_pixels * output_row_pitch_in_blocks_or_pixels))
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: output_blocks_buf_size_in_blocks_or_pixels < (output_rows_in_pixels * output_row_pitch_in_blocks_or_pixels)\n");
				return false;
			}
		}
		else if (fmt == block_format::cFXT1_RGB)
		{
			const uint32_t num_blocks_fxt1_x = (slice_desc.m_orig_width + 7) / 8;
			const uint32_t num_blocks_fxt1_y = (slice_desc.m_orig_height + 3) / 4;
			const uint32_t total_blocks_fxt1 = num_blocks_fxt1_x * num_blocks_fxt1_y;

			if (output_blocks_buf_size_in_blocks_or_pixels < total_blocks_fxt1)
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: output_blocks_buf_size_in_blocks_or_pixels < total_blocks_fxt1\n");
				return false;
			}
		}
		else
		{
			if (output_blocks_buf_size_in_blocks_or_pixels < total_4x4_blocks)
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: output_blocks_buf_size_in_blocks_or_pixels < total_blocks\n");
				return false;
			}
		}

		if (fmt != block_format::cETC1)
		{
			if ((fmt == block_format::cPVRTC1_4_RGB) || (fmt == block_format::cPVRTC1_4_RGBA))
			{
				if ((!basisu::is_pow2(slice_desc.m_num_blocks_x * 4)) || (!basisu::is_pow2(slice_desc.m_num_blocks_y * 4)))
				{
					// PVRTC1 only supports power of 2 dimensions
					BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: PVRTC1 only supports power of 2 dimensions\n");
					return false;
				}
			}
		}

		if (slice_desc.m_file_ofs > data_size)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: invalid slice_desc.m_file_ofs, or passed in buffer too small\n");
			return false;
		}

		const uint32_t data_size_left = data_size - slice_desc.m_file_ofs;
		if (data_size_left < slice_desc.m_file_size)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: invalid slice_desc.m_file_size, or passed in buffer too small\n");
			return false;
		}
				
		if (pHeader->m_tex_format == (int)basis_tex_format::cUASTC4x4)
		{
			return m_lowlevel_uastc_decoder.transcode_slice(pOutput_blocks, slice_desc.m_num_blocks_x, slice_desc.m_num_blocks_y,
				pDataU8 + slice_desc.m_file_ofs, slice_desc.m_file_size,
				fmt, output_block_or_pixel_stride_in_bytes, (decode_flags & cDecodeFlagsBC1ForbidThreeColorBlocks) == 0, *pHeader, slice_desc, output_row_pitch_in_blocks_or_pixels, pState,
				output_rows_in_pixels, channel0, channel1, decode_flags);
		}
		else
		{
			return m_lowlevel_etc1s_decoder.transcode_slice(pOutput_blocks, slice_desc.m_num_blocks_x, slice_desc.m_num_blocks_y,
				pDataU8 + slice_desc.m_file_ofs, slice_desc.m_file_size,
				fmt, output_block_or_pixel_stride_in_bytes, (decode_flags & cDecodeFlagsBC1ForbidThreeColorBlocks) == 0, *pHeader, slice_desc, output_row_pitch_in_blocks_or_pixels, pState,
				(decode_flags & cDecodeFlagsOutputHasAlphaIndices) != 0, pAlpha_blocks, output_rows_in_pixels);
		}
	}